

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# toplevel_unit.c
# Opt level: O3

void frozen_serialization_compare(roaring_bitmap_t *r1)

{
  _Bool _Var1;
  size_t size;
  char *buf;
  roaring_bitmap_t *r2;
  roaring_bitmap_t *prVar2;
  
  size = roaring_bitmap_frozen_size_in_bytes(r1);
  buf = (char *)roaring_aligned_malloc(0x20,size);
  roaring_bitmap_frozen_serialize(r1,buf);
  r2 = roaring_bitmap_frozen_view(buf,size);
  _Var1 = roaring_bitmap_equals(r1,r2);
  _assert_true((ulong)_Var1,"roaring_bitmap_equals(r1, r2)",
               "/workspace/llm4binary/github/license_all_cmakelists_25/lucaderi[P]CRoaring/tests/toplevel_unit.c"
               ,0x1191);
  prVar2 = roaring_bitmap_frozen_view(buf + 1,size - 1);
  _assert_true((ulong)(prVar2 == (roaring_bitmap_t *)0x0),
               "roaring_bitmap_frozen_view(buf + 1, num_bytes - 1) == NULL",
               "/workspace/llm4binary/github/license_all_cmakelists_25/lucaderi[P]CRoaring/tests/toplevel_unit.c"
               ,0x1192);
  roaring_bitmap_free(r1);
  roaring_bitmap_free(r2);
  roaring_aligned_free(buf);
  return;
}

Assistant:

void frozen_serialization_compare(roaring_bitmap_t *r1) {
    size_t num_bytes = roaring_bitmap_frozen_size_in_bytes(r1);
    char *buf = (char *)roaring_aligned_malloc(32, num_bytes);
    roaring_bitmap_frozen_serialize(r1, buf);

    const roaring_bitmap_t *r2 = roaring_bitmap_frozen_view(buf, num_bytes);

    assert_true(roaring_bitmap_equals(r1, r2));
    assert_true(roaring_bitmap_frozen_view(buf + 1, num_bytes - 1) == NULL);

    roaring_bitmap_free(r1);
    roaring_bitmap_free(r2);
    roaring_aligned_free(buf);
}